

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

void Gia_ManTestStruct(Gia_Man_t *p)

{
  int iVar1;
  uint nLeaves;
  Vec_Int_t *vLeaves;
  ulong uVar2;
  int *piVar3;
  Gia_Obj_t *pRoot;
  word *pTruth;
  long lVar4;
  int iVar5;
  int LutNDecomp [8];
  int LutCount [8];
  
  LutCount[4] = 0;
  LutCount[5] = 0;
  LutCount[6] = 0;
  LutCount[7] = 0;
  LutCount[0] = 0;
  LutCount[1] = 0;
  LutCount[2] = 0;
  LutCount[3] = 0;
  LutNDecomp[4] = 0;
  LutNDecomp[5] = 0;
  LutNDecomp[6] = 0;
  LutNDecomp[7] = 0;
  LutNDecomp[0] = 0;
  LutNDecomp[1] = 0;
  LutNDecomp[2] = 0;
  LutNDecomp[3] = 0;
  vLeaves = Vec_IntAlloc(100);
  Gia_ObjComputeTruthTableStart(p,7);
  iVar5 = 1;
  do {
    if (p->nObjs <= iVar5) {
      Gia_ObjComputeTruthTableStop(p);
      printf("LUT5 = %d    ",(ulong)LutCount._16_8_ >> 0x20);
      iVar5 = 1;
      if (1 < LutCount[6]) {
        iVar5 = LutCount[6];
      }
      printf("LUT6 = %d  NonDec = %d (%.2f %%)    ",
             SUB84(((double)LutNDecomp[6] * 100.0) / (double)iVar5,0));
      iVar5 = 1;
      if (1 < LutCount[7]) {
        iVar5 = LutCount[7];
      }
      printf("LUT7 = %d  NonDec = %d (%.2f %%)    ",
             SUB84(((double)LutNDecomp[7] * 100.0) / (double)iVar5,0));
      putchar(10);
      return;
    }
    iVar1 = Gia_ObjIsLut(p,iVar5);
    if (iVar1 != 0) {
      nLeaves = Gia_ObjLutSize(p,iVar5);
      if (7 < (int)nLeaves) {
        __assert_fail("nFanins <= 7",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                      ,0x8ff,"void Gia_ManTestStruct(Gia_Man_t *)");
      }
      uVar2 = 5;
      if (5 < (int)nLeaves) {
        uVar2 = (ulong)nLeaves;
      }
      LutCount[uVar2] = LutCount[uVar2] + 1;
      if (5 < (int)nLeaves) {
        vLeaves->nSize = 0;
        lVar4 = 0;
        while( true ) {
          iVar1 = Gia_ObjLutSize(p,iVar5);
          if (iVar1 <= lVar4) break;
          piVar3 = Gia_ObjLutFanins(p,iVar5);
          Vec_IntPush(vLeaves,piVar3[lVar4]);
          lVar4 = lVar4 + 1;
        }
        pRoot = Gia_ManObj(p,iVar5);
        pTruth = Gia_ObjComputeTruthTableCut(p,pRoot,vLeaves);
        iVar1 = If_CutPerformCheck07((If_Man_t *)0x0,(uint *)pTruth,7,nLeaves,(char *)0x0);
        if ((iVar1 != 1) &&
           (iVar1 = LutNDecomp[nLeaves], LutNDecomp[nLeaves] = iVar1 + 1, iVar1 < 10)) {
          Kit_DsdPrintFromTruth((uint *)pTruth,nLeaves);
          putchar(10);
        }
      }
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

void Gia_ManTestStruct( Gia_Man_t * p )
{
    int nCutMax = 7;
    int LutCount[8] = {0}, LutNDecomp[8] = {0};
    int i, k, iFan, nFanins, Status;
    Vec_Int_t * vLeaves;
    word * pTruth;

    vLeaves = Vec_IntAlloc( 100 );
    Gia_ObjComputeTruthTableStart( p, nCutMax );
    Gia_ManForEachLut( p, i )
    {
        nFanins = Gia_ObjLutSize(p, i);
        assert( nFanins <= 7 );
        LutCount[Abc_MaxInt(nFanins, 5)]++;
        if ( nFanins <= 5 )
            continue;
        Vec_IntClear( vLeaves );
        Gia_LutForEachFanin( p, i, iFan, k )
            Vec_IntPush( vLeaves, iFan );
        pTruth = Gia_ObjComputeTruthTableCut( p, Gia_ManObj(p, i), vLeaves );
        // check if it is decomposable
        Status = If_CutPerformCheck07( NULL, (unsigned *)pTruth, 7, nFanins, NULL );
        if ( Status == 1 )
            continue;
        LutNDecomp[nFanins]++;
        if ( LutNDecomp[nFanins] > 10 )
            continue;
        Kit_DsdPrintFromTruth( (unsigned *)pTruth, nFanins ); printf( "\n" );
    }
    Gia_ObjComputeTruthTableStop( p );

    printf( "LUT5 = %d    ", LutCount[5] );
    printf( "LUT6 = %d  NonDec = %d (%.2f %%)    ", LutCount[6], LutNDecomp[6], 100.0 * LutNDecomp[6]/Abc_MaxInt(LutCount[6], 1) );
    printf( "LUT7 = %d  NonDec = %d (%.2f %%)    ", LutCount[7], LutNDecomp[7], 100.0 * LutNDecomp[7]/Abc_MaxInt(LutCount[7], 1) );
    printf( "\n" );
}